

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::RangeSink::AddFileRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t fileoff,uint64_t filesize)

{
  RangeMap *this_00;
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  Nonnull<char_*> pcVar4;
  size_t num_args;
  pointer ppVar5;
  string_view format;
  string label;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  uint64_t local_f8;
  RangeSink *local_f0;
  string local_e8;
  long local_c8;
  Nonnull<char_*> pcStack_c0;
  long local_b8;
  Nonnull<char_*> local_b0;
  ulong local_a8;
  char *local_a0;
  long local_90;
  Nonnull<char_*> pcStack_88;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  verbose = IsVerboseForFileRange(this,fileoff,filesize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddFileRange(%.*s, %lx, %lx)\n",pcVar3,analyzer,name._M_len & 0xffffffff,
           name._M_str,fileoff,filesize);
  }
  ppVar1 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = this;
  local_f8 = fileoff;
  for (ppVar5 = (this->outputs_).
                super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    NameMunger::Munge_abi_cxx11_(&local_e8,ppVar5->second,name);
    this_00 = &ppVar5->first->file_map;
    if (local_f0->translator_ == (DualMap *)0x0) {
      RangeMap::AddRange(this_00,fileoff,filesize,&local_e8);
    }
    else {
      num_args = (size_t)verbose;
      bVar2 = RangeMap::AddRangeWithTranslation
                        (this_00,fileoff,filesize,&local_e8,&local_f0->translator_->file_map,verbose
                         ,&ppVar5->first->vm_map);
      if (!bVar2 && 0 < verbose_level) {
        pcVar4 = absl::numbers_internal::FastIntToBuffer(fileoff,local_80);
        local_90 = (long)pcVar4 - (long)local_80;
        pcStack_88 = local_80;
        pcVar4 = absl::numbers_internal::FastIntToBuffer(filesize,local_50);
        local_b8 = (long)pcVar4 - (long)local_50;
        local_110 = 0;
        local_108 = 0;
        local_c8 = local_90;
        pcStack_c0 = pcStack_88;
        format._M_str = (char *)&local_c8;
        format._M_len = (size_t)"File range ($0, $1) for label $2 extends beyond base map";
        local_118 = &local_108;
        local_b0 = local_50;
        local_a8 = name._M_len;
        local_a0 = name._M_str;
        local_60 = local_b8;
        local_58 = local_50;
        absl::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_118,(Nonnull<std::string_*>)0x38,format,
                   (Nullable<const_absl::string_view_*>)0x3,num_args);
        printf("WARNING: %s\n",local_118);
        fileoff = local_f8;
        if (local_118 != &local_108) {
          operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
          fileoff = local_f8;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void RangeSink::AddFileRange(const char* analyzer, string_view name,
                             uint64_t fileoff, uint64_t filesize) {
  bool verbose = IsVerboseForFileRange(fileoff, filesize);
  if (verbose) {
    printf("[%s, %s] AddFileRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), fileoff, filesize);
  }
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    if (translator_) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          fileoff, filesize, label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             fileoff, filesize, name);
      }
    } else {
      pair.first->file_map.AddRange(fileoff, filesize, label);
    }
  }
}